

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

GLenum deqp::gls::FboUtil::config::attachmentType(Attachment *att)

{
  GLenum GVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(att,&Attachment::typeinfo,&RenderbufferAttachment::typeinfo,0);
  GVar1 = 0x8d41;
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(att,&Attachment::typeinfo,&TextureAttachment::typeinfo,0);
    GVar1 = 0x1702;
    if (lVar2 == 0) {
      GVar1 = 0;
    }
  }
  return GVar1;
}

Assistant:

GLenum attachmentType (const Attachment& att)
{
	if (dynamic_cast<const RenderbufferAttachment*>(&att) != DE_NULL)
		return GL_RENDERBUFFER;
	else if (dynamic_cast<const TextureAttachment*>(&att) != DE_NULL)
		return GL_TEXTURE;

	DE_FATAL("Impossible attachment type");
	return GL_NONE;
}